

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masked_variance_intrin_ssse3.c
# Opt level: O0

void accumulate_block(__m128i *src,__m128i *a,__m128i *b,__m128i *m,__m128i *sum,__m128i *sum_sq)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *puVar11;
  undefined8 *in_RDI;
  int *in_R8;
  int *in_R9;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  __m128i v_val_w;
  __m128i alVar14;
  __m128i diff_r;
  __m128i diff_l;
  __m128i src_r;
  __m128i src_l;
  __m128i pred_r;
  __m128i mask_r;
  __m128i data_r;
  __m128i pred_l;
  __m128i mask_l;
  __m128i data_l;
  __m128i m_inv;
  __m128i mask_max;
  __m128i one;
  __m128i zero;
  byte local_278;
  byte bStack_277;
  byte bStack_276;
  byte bStack_275;
  byte bStack_274;
  byte bStack_273;
  byte bStack_272;
  byte bStack_271;
  undefined1 local_258;
  undefined1 uStack_257;
  undefined1 uStack_256;
  undefined1 uStack_255;
  undefined1 uStack_254;
  undefined1 uStack_253;
  undefined1 uStack_252;
  undefined1 uStack_251;
  undefined1 local_248;
  undefined1 uStack_247;
  undefined1 uStack_246;
  undefined1 uStack_245;
  undefined1 uStack_244;
  undefined1 uStack_243;
  undefined1 uStack_242;
  undefined1 uStack_241;
  undefined1 local_238;
  undefined1 uStack_237;
  undefined1 uStack_236;
  undefined1 uStack_235;
  undefined1 uStack_234;
  undefined1 uStack_233;
  undefined1 uStack_232;
  undefined1 uStack_231;
  byte bStack_1d0;
  byte bStack_1cf;
  byte bStack_1ce;
  byte bStack_1cd;
  byte bStack_1cc;
  byte bStack_1cb;
  byte bStack_1ca;
  byte bStack_1c9;
  undefined1 uStack_1b0;
  undefined1 uStack_1af;
  undefined1 uStack_1ae;
  undefined1 uStack_1ad;
  undefined1 uStack_1ac;
  undefined1 uStack_1ab;
  undefined1 uStack_1aa;
  undefined1 uStack_1a9;
  undefined1 uStack_1a0;
  undefined1 uStack_19f;
  undefined1 uStack_19e;
  undefined1 uStack_19d;
  undefined1 uStack_19c;
  undefined1 uStack_19b;
  undefined1 uStack_19a;
  undefined1 uStack_199;
  undefined1 uStack_190;
  undefined1 uStack_18f;
  undefined1 uStack_18e;
  undefined1 uStack_18d;
  undefined1 uStack_18c;
  undefined1 uStack_18b;
  undefined1 uStack_18a;
  undefined1 uStack_189;
  char local_168;
  char cStack_167;
  char cStack_166;
  char cStack_165;
  char cStack_164;
  char cStack_163;
  char cStack_162;
  char cStack_161;
  char cStack_160;
  char cStack_15f;
  char cStack_15e;
  char cStack_15d;
  char cStack_15c;
  char cStack_15b;
  char cStack_15a;
  char cStack_159;
  ushort uStack_146;
  ushort uStack_144;
  ushort uStack_142;
  ushort uStack_13e;
  ushort uStack_13c;
  ushort uStack_13a;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  ushort uStack_126;
  ushort uStack_124;
  ushort uStack_122;
  ushort uStack_11e;
  ushort uStack_11c;
  ushort uStack_11a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  
  uVar1 = *in_RCX;
  uVar2 = in_RCX[1];
  local_168 = (char)uVar1;
  cStack_167 = (char)((ulong)uVar1 >> 8);
  cStack_166 = (char)((ulong)uVar1 >> 0x10);
  cStack_165 = (char)((ulong)uVar1 >> 0x18);
  cStack_164 = (char)((ulong)uVar1 >> 0x20);
  cStack_163 = (char)((ulong)uVar1 >> 0x28);
  cStack_162 = (char)((ulong)uVar1 >> 0x30);
  cStack_161 = (char)((ulong)uVar1 >> 0x38);
  cStack_160 = (char)uVar2;
  cStack_15f = (char)((ulong)uVar2 >> 8);
  cStack_15e = (char)((ulong)uVar2 >> 0x10);
  cStack_15d = (char)((ulong)uVar2 >> 0x18);
  cStack_15c = (char)((ulong)uVar2 >> 0x20);
  cStack_15b = (char)((ulong)uVar2 >> 0x28);
  cStack_15a = (char)((ulong)uVar2 >> 0x30);
  cStack_159 = (char)((ulong)uVar2 >> 0x38);
  uVar1 = *in_RSI;
  uVar2 = *in_RDX;
  local_238 = (undefined1)uVar1;
  uStack_237 = (undefined1)((ulong)uVar1 >> 8);
  uStack_236 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_235 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_234 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_233 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_232 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_231 = (undefined1)((ulong)uVar1 >> 0x38);
  local_248 = (undefined1)uVar2;
  uStack_247 = (undefined1)((ulong)uVar2 >> 8);
  uStack_246 = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_245 = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_244 = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_243 = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_242 = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_241 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = *in_RCX;
  local_258 = (undefined1)uVar1;
  uStack_257 = (undefined1)((ulong)uVar1 >> 8);
  uStack_256 = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_255 = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_254 = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_253 = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_252 = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_251 = (undefined1)((ulong)uVar1 >> 0x38);
  auVar4[1] = local_248;
  auVar4[0] = local_238;
  auVar4[2] = uStack_237;
  auVar4[3] = uStack_247;
  auVar4[4] = uStack_236;
  auVar4[5] = uStack_246;
  auVar4[6] = uStack_235;
  auVar4[7] = uStack_245;
  auVar4[9] = uStack_244;
  auVar4[8] = uStack_234;
  auVar4[10] = uStack_233;
  auVar4[0xb] = uStack_243;
  auVar4[0xc] = uStack_232;
  auVar4[0xd] = uStack_242;
  auVar4[0xe] = uStack_231;
  auVar4[0xf] = uStack_241;
  auVar3[1] = '@' - local_168;
  auVar3[0] = local_258;
  auVar3[2] = uStack_257;
  auVar3[3] = '@' - cStack_167;
  auVar3[4] = uStack_256;
  auVar3[5] = '@' - cStack_166;
  auVar3[6] = uStack_255;
  auVar3[7] = '@' - cStack_165;
  auVar3[9] = '@' - cStack_164;
  auVar3[8] = uStack_254;
  auVar3[10] = uStack_253;
  auVar3[0xb] = '@' - cStack_163;
  auVar3[0xc] = uStack_252;
  auVar3[0xd] = '@' - cStack_162;
  auVar3[0xe] = uStack_251;
  auVar3[0xf] = '@' - cStack_161;
  pmaddubsw(auVar4,auVar3);
  alVar14[1] = (longlong)in_RSI;
  alVar14[0] = 6;
  puVar11 = in_RSI;
  alVar14 = xx_roundn_epu16(alVar14,(int)in_RDX);
  uVar1 = in_RSI[1];
  uVar2 = in_RDX[1];
  uStack_190 = (undefined1)uVar1;
  uStack_18f = (undefined1)((ulong)uVar1 >> 8);
  uStack_18e = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_18d = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_18c = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_18b = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_18a = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_189 = (undefined1)((ulong)uVar1 >> 0x38);
  uStack_1a0 = (undefined1)uVar2;
  uStack_19f = (undefined1)((ulong)uVar2 >> 8);
  uStack_19e = (undefined1)((ulong)uVar2 >> 0x10);
  uStack_19d = (undefined1)((ulong)uVar2 >> 0x18);
  uStack_19c = (undefined1)((ulong)uVar2 >> 0x20);
  uStack_19b = (undefined1)((ulong)uVar2 >> 0x28);
  uStack_19a = (undefined1)((ulong)uVar2 >> 0x30);
  uStack_199 = (undefined1)((ulong)uVar2 >> 0x38);
  uVar1 = in_RCX[1];
  uStack_1b0 = (undefined1)uVar1;
  uStack_1af = (undefined1)((ulong)uVar1 >> 8);
  uStack_1ae = (undefined1)((ulong)uVar1 >> 0x10);
  uStack_1ad = (undefined1)((ulong)uVar1 >> 0x18);
  uStack_1ac = (undefined1)((ulong)uVar1 >> 0x20);
  uStack_1ab = (undefined1)((ulong)uVar1 >> 0x28);
  uStack_1aa = (undefined1)((ulong)uVar1 >> 0x30);
  uStack_1a9 = (undefined1)((ulong)uVar1 >> 0x38);
  auVar13[1] = uStack_1a0;
  auVar13[0] = uStack_190;
  auVar13[2] = uStack_18f;
  auVar13[3] = uStack_19f;
  auVar13[4] = uStack_18e;
  auVar13[5] = uStack_19e;
  auVar13[6] = uStack_18d;
  auVar13[7] = uStack_19d;
  auVar13[9] = uStack_19c;
  auVar13[8] = uStack_18c;
  auVar13[10] = uStack_18b;
  auVar13[0xb] = uStack_19b;
  auVar13[0xc] = uStack_18a;
  auVar13[0xd] = uStack_19a;
  auVar13[0xe] = uStack_189;
  auVar13[0xf] = uStack_199;
  auVar12[1] = '@' - cStack_160;
  auVar12[0] = uStack_1b0;
  auVar12[2] = uStack_1af;
  auVar12[3] = '@' - cStack_15f;
  auVar12[4] = uStack_1ae;
  auVar12[5] = '@' - cStack_15e;
  auVar12[6] = uStack_1ad;
  auVar12[7] = '@' - cStack_15d;
  auVar12[9] = '@' - cStack_15c;
  auVar12[8] = uStack_1ac;
  auVar12[10] = uStack_1ab;
  auVar12[0xb] = '@' - cStack_15b;
  auVar12[0xc] = uStack_1aa;
  auVar12[0xd] = '@' - cStack_15a;
  auVar12[0xe] = uStack_1a9;
  auVar12[0xf] = '@' - cStack_159;
  pmaddubsw(auVar13,auVar12);
  v_val_w[1] = (longlong)puVar11;
  v_val_w[0] = 6;
  xx_roundn_epu16(v_val_w,(int)alVar14[1]);
  uVar1 = *in_RDI;
  local_278 = (byte)uVar1;
  bStack_277 = (byte)((ulong)uVar1 >> 8);
  bStack_276 = (byte)((ulong)uVar1 >> 0x10);
  bStack_275 = (byte)((ulong)uVar1 >> 0x18);
  bStack_274 = (byte)((ulong)uVar1 >> 0x20);
  bStack_273 = (byte)((ulong)uVar1 >> 0x28);
  bStack_272 = (byte)((ulong)uVar1 >> 0x30);
  bStack_271 = (byte)((ulong)uVar1 >> 0x38);
  uVar1 = in_RDI[1];
  bStack_1d0 = (byte)uVar1;
  bStack_1cf = (byte)((ulong)uVar1 >> 8);
  bStack_1ce = (byte)((ulong)uVar1 >> 0x10);
  bStack_1cd = (byte)((ulong)uVar1 >> 0x18);
  bStack_1cc = (byte)((ulong)uVar1 >> 0x20);
  bStack_1cb = (byte)((ulong)uVar1 >> 0x28);
  bStack_1ca = (byte)((ulong)uVar1 >> 0x30);
  bStack_1c9 = (byte)((ulong)uVar1 >> 0x38);
  local_118 = (short)extraout_XMM0_Qa;
  sStack_116 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
  sStack_114 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
  sStack_112 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
  sStack_110 = (short)extraout_XMM0_Qb;
  sStack_10e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
  sStack_10c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
  sStack_10a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
  uStack_126 = (ushort)bStack_277;
  uStack_124 = (ushort)bStack_276;
  uStack_122 = (ushort)bStack_275;
  uStack_11e = (ushort)bStack_273;
  uStack_11c = (ushort)bStack_272;
  uStack_11a = (ushort)bStack_271;
  local_118 = local_118 - (ushort)local_278;
  sStack_116 = sStack_116 - uStack_126;
  sStack_114 = sStack_114 - uStack_124;
  sStack_112 = sStack_112 - uStack_122;
  sStack_110 = sStack_110 - (ushort)bStack_274;
  sStack_10e = sStack_10e - uStack_11e;
  sStack_10c = sStack_10c - uStack_11c;
  sStack_10a = sStack_10a - uStack_11a;
  local_138 = (short)extraout_XMM0_Qa_00;
  sStack_136 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
  sStack_134 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
  sStack_132 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
  sStack_130 = (short)extraout_XMM0_Qb_00;
  sStack_12e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
  sStack_12c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
  sStack_12a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
  uStack_146 = (ushort)bStack_1cf;
  uStack_144 = (ushort)bStack_1ce;
  uStack_142 = (ushort)bStack_1cd;
  uStack_13e = (ushort)bStack_1cb;
  uStack_13c = (ushort)bStack_1ca;
  uStack_13a = (ushort)bStack_1c9;
  local_138 = local_138 - (ushort)bStack_1d0;
  sStack_136 = sStack_136 - uStack_146;
  sStack_134 = sStack_134 - uStack_144;
  sStack_132 = sStack_132 - uStack_142;
  sStack_130 = sStack_130 - (ushort)bStack_1cc;
  sStack_12e = sStack_12e - uStack_13e;
  sStack_12c = sStack_12c - uStack_13c;
  sStack_12a = sStack_12a - uStack_13a;
  auVar10._2_2_ = sStack_116 + sStack_136;
  auVar10._0_2_ = local_118 + local_138;
  auVar10._4_2_ = sStack_114 + sStack_134;
  auVar10._6_2_ = sStack_112 + sStack_132;
  auVar10._8_2_ = sStack_110 + sStack_130;
  auVar10._10_2_ = sStack_10e + sStack_12e;
  auVar10._12_2_ = sStack_10c + sStack_12c;
  auVar10._14_2_ = sStack_10a + sStack_12a;
  auVar9._8_8_ = 0x1000100010001;
  auVar9._0_8_ = 0x1000100010001;
  auVar12 = pmaddwd(auVar10,auVar9);
  local_b8 = (int)*(undefined8 *)in_R8;
  iStack_b4 = (int)((ulong)*(undefined8 *)in_R8 >> 0x20);
  iStack_b0 = (int)*(undefined8 *)(in_R8 + 2);
  iStack_ac = (int)((ulong)*(undefined8 *)(in_R8 + 2) >> 0x20);
  local_c8 = auVar12._0_4_;
  iStack_c4 = auVar12._4_4_;
  iStack_c0 = auVar12._8_4_;
  iStack_bc = auVar12._12_4_;
  *in_R8 = local_b8 + local_c8;
  in_R8[1] = iStack_b4 + iStack_c4;
  in_R8[2] = iStack_b0 + iStack_c0;
  in_R8[3] = iStack_ac + iStack_bc;
  auVar8._2_2_ = sStack_116;
  auVar8._0_2_ = local_118;
  auVar8._4_2_ = sStack_114;
  auVar8._6_2_ = sStack_112;
  auVar8._10_2_ = sStack_10e;
  auVar8._8_2_ = sStack_110;
  auVar8._12_2_ = sStack_10c;
  auVar8._14_2_ = sStack_10a;
  auVar7._2_2_ = sStack_116;
  auVar7._0_2_ = local_118;
  auVar7._4_2_ = sStack_114;
  auVar7._6_2_ = sStack_112;
  auVar7._10_2_ = sStack_10e;
  auVar7._8_2_ = sStack_110;
  auVar7._12_2_ = sStack_10c;
  auVar7._14_2_ = sStack_10a;
  auVar13 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = sStack_136;
  auVar6._0_2_ = local_138;
  auVar6._4_2_ = sStack_134;
  auVar6._6_2_ = sStack_132;
  auVar6._10_2_ = sStack_12e;
  auVar6._8_2_ = sStack_130;
  auVar6._12_2_ = sStack_12c;
  auVar6._14_2_ = sStack_12a;
  auVar5._2_2_ = sStack_136;
  auVar5._0_2_ = local_138;
  auVar5._4_2_ = sStack_134;
  auVar5._6_2_ = sStack_132;
  auVar5._10_2_ = sStack_12e;
  auVar5._8_2_ = sStack_130;
  auVar5._12_2_ = sStack_12c;
  auVar5._14_2_ = sStack_12a;
  auVar12 = pmaddwd(auVar6,auVar5);
  local_d8 = auVar13._0_4_;
  iStack_d4 = auVar13._4_4_;
  iStack_d0 = auVar13._8_4_;
  iStack_cc = auVar13._12_4_;
  local_e8 = auVar12._0_4_;
  iStack_e4 = auVar12._4_4_;
  iStack_e0 = auVar12._8_4_;
  iStack_dc = auVar12._12_4_;
  local_f8 = (int)*(undefined8 *)in_R9;
  iStack_f4 = (int)((ulong)*(undefined8 *)in_R9 >> 0x20);
  iStack_f0 = (int)*(undefined8 *)(in_R9 + 2);
  iStack_ec = (int)((ulong)*(undefined8 *)(in_R9 + 2) >> 0x20);
  *in_R9 = local_f8 + local_d8 + local_e8;
  in_R9[1] = iStack_f4 + iStack_d4 + iStack_e4;
  in_R9[2] = iStack_f0 + iStack_d0 + iStack_e0;
  in_R9[3] = iStack_ec + iStack_cc + iStack_dc;
  return;
}

Assistant:

static inline void accumulate_block(const __m128i *src, const __m128i *a,
                                    const __m128i *b, const __m128i *m,
                                    __m128i *sum, __m128i *sum_sq) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i mask_max = _mm_set1_epi8((1 << AOM_BLEND_A64_ROUND_BITS));
  const __m128i m_inv = _mm_sub_epi8(mask_max, *m);

  // Calculate 16 predicted pixels.
  // Note that the maximum value of any entry of 'pred_l' or 'pred_r'
  // is 64 * 255, so we have plenty of space to add rounding constants.
  const __m128i data_l = _mm_unpacklo_epi8(*a, *b);
  const __m128i mask_l = _mm_unpacklo_epi8(*m, m_inv);
  __m128i pred_l = _mm_maddubs_epi16(data_l, mask_l);
  pred_l = xx_roundn_epu16(pred_l, AOM_BLEND_A64_ROUND_BITS);

  const __m128i data_r = _mm_unpackhi_epi8(*a, *b);
  const __m128i mask_r = _mm_unpackhi_epi8(*m, m_inv);
  __m128i pred_r = _mm_maddubs_epi16(data_r, mask_r);
  pred_r = xx_roundn_epu16(pred_r, AOM_BLEND_A64_ROUND_BITS);

  const __m128i src_l = _mm_unpacklo_epi8(*src, zero);
  const __m128i src_r = _mm_unpackhi_epi8(*src, zero);
  const __m128i diff_l = _mm_sub_epi16(pred_l, src_l);
  const __m128i diff_r = _mm_sub_epi16(pred_r, src_r);

  // Update partial sums and partial sums of squares
  *sum =
      _mm_add_epi32(*sum, _mm_madd_epi16(_mm_add_epi16(diff_l, diff_r), one));
  *sum_sq =
      _mm_add_epi32(*sum_sq, _mm_add_epi32(_mm_madd_epi16(diff_l, diff_l),
                                           _mm_madd_epi16(diff_r, diff_r)));
}